

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login1.c
# Opt level: O2

void ssh1_login_setup_tis_scc(ssh1_login_state *s)

{
  Seat *pSVar1;
  StripCtrlChars *sccpub;
  
  if (s->tis_scc_initialised == false) {
    pSVar1 = (s->ppl).seat;
    sccpub = (*pSVar1->vt->stripctrl_new)(pSVar1,(BinarySink *)0x0,SIC_KI_PROMPTS);
    s->tis_scc = sccpub;
    if (sccpub != (StripCtrlChars *)0x0) {
      stripctrl_enable_line_limiting(sccpub);
    }
    s->tis_scc_initialised = true;
  }
  return;
}

Assistant:

static void ssh1_login_setup_tis_scc(struct ssh1_login_state *s)
{
    if (s->tis_scc_initialised)
        return;
    s->tis_scc = seat_stripctrl_new(s->ppl.seat, NULL, SIC_KI_PROMPTS);
    if (s->tis_scc)
        stripctrl_enable_line_limiting(s->tis_scc);
    s->tis_scc_initialised = true;
}